

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O3

unsigned_long lh_char_hash(void *k)

{
  int iVar1;
  ulong uVar2;
  unsigned_long uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (lh_char_hash::random_seed == -1) {
    do {
      iVar1 = json_c_get_random_seed();
    } while (iVar1 == -1);
    LOCK();
    if (lh_char_hash::random_seed != -1) {
      iVar1 = lh_char_hash::random_seed;
    }
    lh_char_hash::random_seed = iVar1;
    UNLOCK();
  }
  uVar2 = strlen((char *)k);
  uVar4 = lh_char_hash::random_seed + (int)uVar2 + 0xdeadbeef;
  uVar5 = uVar4;
  uVar7 = uVar4;
  if (((ulong)k & 3) != 0) {
    if (((ulong)k & 1) == 0) {
      for (; 0xc < uVar2; uVar2 = uVar2 - 0xc) {
        uVar5 = uVar5 + *(int *)((long)k + 8);
        uVar4 = (uVar5 * 0x10 | uVar5 >> 0x1c) ^ (uVar4 + *k) - uVar5;
        iVar1 = uVar5 + uVar7 + *(int *)((long)k + 4);
        uVar5 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar7 + *(int *)((long)k + 4)) - uVar4;
        iVar6 = uVar4 + iVar1;
        uVar7 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar1 - uVar5;
        iVar1 = uVar5 + iVar6;
        uVar4 = (uVar7 << 0x10 | uVar7 >> 0x10) ^ iVar6 - uVar7;
        iVar6 = uVar7 + iVar1;
        uVar7 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar1 - uVar4;
        uVar4 = uVar4 + iVar6;
        k = (void *)((long)k + 0xc);
        uVar5 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar6 - uVar7;
        uVar7 = uVar7 + uVar4;
      }
      uVar3 = (*(code *)(&DAT_0010c184 + *(int *)(&DAT_0010c184 + uVar2 * 4)))
                        (&DAT_0010c184,uVar4,uVar7);
      return uVar3;
    }
    for (; 0xc < uVar2; uVar2 = uVar2 - 0xc) {
      iVar1 = (uint)*(byte *)((long)k + 7) * 0x1000000 + (uint)*(byte *)((long)k + 6) * 0x10000 +
              (uint)*(byte *)((long)k + 5) * 0x100 + *(byte *)((long)k + 4) + uVar7;
      uVar5 = (uint)*(byte *)((long)k + 0xb) * 0x1000000 + (uint)*(byte *)((long)k + 10) * 0x10000 +
              (uint)*(byte *)((long)k + 9) * 0x100 + *(byte *)((long)k + 8) + uVar5;
      uVar4 = (uVar5 * 0x10 | uVar5 >> 0x1c) ^
              ((uint)*(byte *)((long)k + 3) * 0x1000000 + (uint)*(byte *)((long)k + 2) * 0x10000 +
              (uint)*(byte *)((long)k + 1) * 0x100 + *k + uVar4) - uVar5;
      iVar6 = uVar5 + iVar1;
      uVar5 = (uVar4 << 6 | uVar4 >> 0x1a) ^ iVar1 - uVar4;
      iVar1 = uVar4 + iVar6;
      uVar7 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar6 - uVar5;
      iVar6 = uVar5 + iVar1;
      uVar4 = (uVar7 << 0x10 | uVar7 >> 0x10) ^ iVar1 - uVar7;
      iVar1 = uVar7 + iVar6;
      uVar7 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar6 - uVar4;
      uVar4 = uVar4 + iVar1;
      k = (void *)((long)k + 0xc);
      uVar5 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar1 - uVar7;
      uVar7 = uVar7 + uVar4;
    }
    uVar3 = (*(code *)(&DAT_0010c150 + *(int *)(&DAT_0010c150 + uVar2 * 4)))
                      (uVar4,&DAT_0010c150,uVar7);
    return uVar3;
  }
  for (; 0xc < uVar2; uVar2 = uVar2 - 0xc) {
    uVar5 = uVar5 + *(int *)((long)k + 8);
    uVar4 = (uVar5 * 0x10 | uVar5 >> 0x1c) ^ (uVar4 + *k) - uVar5;
    iVar1 = uVar5 + uVar7 + *(int *)((long)k + 4);
    uVar5 = (uVar4 << 6 | uVar4 >> 0x1a) ^ (uVar7 + *(int *)((long)k + 4)) - uVar4;
    iVar6 = uVar4 + iVar1;
    uVar7 = (uVar5 << 8 | uVar5 >> 0x18) ^ iVar1 - uVar5;
    iVar1 = uVar5 + iVar6;
    uVar4 = (uVar7 << 0x10 | uVar7 >> 0x10) ^ iVar6 - uVar7;
    iVar6 = uVar7 + iVar1;
    uVar7 = (uVar4 << 0x13 | uVar4 >> 0xd) ^ iVar1 - uVar4;
    uVar4 = uVar4 + iVar6;
    k = (void *)((long)k + 0xc);
    uVar5 = (uVar7 << 4 | uVar7 >> 0x1c) ^ iVar6 - uVar7;
    uVar7 = uVar7 + uVar4;
  }
  uVar3 = (*(code *)(&DAT_0010c1b8 + *(int *)(&DAT_0010c1b8 + uVar2 * 4)))
                    (uVar4,&DAT_0010c1b8,uVar7);
  return uVar3;
}

Assistant:

static unsigned long lh_char_hash(const void *k)
{
#if defined _MSC_VER || defined __MINGW32__
#define RANDOM_SEED_TYPE LONG
#else
#define RANDOM_SEED_TYPE int
#endif
	static volatile RANDOM_SEED_TYPE random_seed = -1;

	if (random_seed == -1)
	{
		RANDOM_SEED_TYPE seed;
		/* we can't use -1 as it is the uninitialized sentinel */
		while ((seed = json_c_get_random_seed()) == -1) {}
#if SIZEOF_INT == 8 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_8
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if SIZEOF_INT == 4 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_4
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if SIZEOF_INT == 2 && defined __GCC_HAVE_SYNC_COMPARE_AND_SWAP_2
#define USE_SYNC_COMPARE_AND_SWAP 1
#endif
#if defined USE_SYNC_COMPARE_AND_SWAP
		(void)__sync_val_compare_and_swap(&random_seed, -1, seed);
#elif defined _MSC_VER || defined __MINGW32__
		InterlockedCompareExchange(&random_seed, seed, -1);
#else
		//#warning "racy random seed initialization if used by multiple threads"
		random_seed = seed; /* potentially racy */
#endif
	}

	return hashlittle((const char *)k, strlen((const char *)k), (uint32_t)random_seed);
}